

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrender.c
# Opt level: O0

DUMB_IT_SIGRENDERER *
init_sigrenderer(DUMB_IT_SIGDATA *sigdata,int n_channels,int startorder,IT_CALLBACKS *callbacks,
                DUMB_CLICK_REMOVER **cr)

{
  uchar uVar1;
  DUMB_IT_SIGRENDERER *vsigrenderer;
  void *pvVar2;
  IT_CALLBACKS *in_RCX;
  int in_EDX;
  int in_ESI;
  DUMB_IT_SIGDATA *in_RDI;
  DUMB_CLICK_REMOVER **in_R8;
  int n;
  int order;
  IT_CHANNEL *channel;
  int i;
  DUMB_IT_SIGRENDERER *sigrenderer;
  DUMB_IT_SIGDATA *in_stack_00000ae0;
  undefined4 in_stack_ffffffffffffffb8;
  int iVar3;
  undefined4 in_stack_ffffffffffffffbc;
  int iVar4;
  DUMB_IT_SIGRENDERER *in_stack_ffffffffffffffc0;
  int local_34;
  
  if (in_ESI == 2) {
    if (in_RDI->n_orders < in_EDX) {
      free(in_RCX);
      dumb_destroy_click_remover_array
                ((int)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                 (DUMB_CLICK_REMOVER **)
                 CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    }
    else {
      vsigrenderer = (DUMB_IT_SIGRENDERER *)malloc(0x2e98);
      if (vsigrenderer == (DUMB_IT_SIGRENDERER *)0x0) {
        free(in_RCX);
        dumb_destroy_click_remover_array
                  ((int)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                   (DUMB_CLICK_REMOVER **)
                   CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      }
      else {
        vsigrenderer->free_playing = (IT_PLAYING *)0x0;
        vsigrenderer->callbacks = in_RCX;
        vsigrenderer->click_remover = in_R8;
        vsigrenderer->sigdata = in_RDI;
        vsigrenderer->n_channels = 2;
        vsigrenderer->resampling_quality = dumb_resampling_quality;
        vsigrenderer->ramp_style = 2;
        vsigrenderer->globalvolume = (uchar)in_RDI->global_volume;
        vsigrenderer->tempo = in_RDI->tempo;
        for (local_34 = 0; local_34 < 0x40; local_34 = local_34 + 1) {
          in_stack_ffffffffffffffc0 = (DUMB_IT_SIGRENDERER *)(vsigrenderer->channel + local_34);
          *(int *)&in_stack_ffffffffffffffc0->sigdata =
               (int)(uint)in_RDI->channel_pan[local_34] >> 7;
          uVar1 = '@';
          if ((in_RDI->flags & 0x40U) != 0) {
            uVar1 = '\0';
          }
          *(uchar *)((long)&in_stack_ffffffffffffffc0->sigdata + 4) = uVar1;
          *(byte *)&in_stack_ffffffffffffffc0->n_channels = in_RDI->channel_pan[local_34] & 0x7f;
          *(ushort *)((long)&in_stack_ffffffffffffffc0->n_channels + 2) =
               (ushort)(byte)in_stack_ffffffffffffffc0->n_channels << 8;
          *(uchar *)&in_stack_ffffffffffffffc0->resampling_quality =
               in_RDI->channel_volume[local_34];
          *(uchar *)((long)&in_stack_ffffffffffffffc0->resampling_quality + 2) = '\0';
          *(unsigned_short *)&in_stack_ffffffffffffffc0->channel[0].retrig_tick = 0;
          *(uchar *)((long)&in_stack_ffffffffffffffc0->resampling_quality + 3) = 0xff;
          in_stack_ffffffffffffffc0->globalvolume = '\0';
          in_stack_ffffffffffffffc0->globalvolslide = '\x7f';
          in_stack_ffffffffffffffc0->field_0x12 = '\0';
          *(uchar *)&in_stack_ffffffffffffffc0->channel[0].flags = 0xff;
          *(uchar *)((long)&in_stack_ffffffffffffffc0->channel[0].note_delay_entry + 1) = '\0';
          *(int *)((long)&in_stack_ffffffffffffffc0->channel[0].note_delay_entry + 4) = 0;
          in_stack_ffffffffffffffc0->channel[0].field_0x21 = '\0';
          in_stack_ffffffffffffffc0->channel[0].field_0x22 = '\0';
          in_stack_ffffffffffffffc0->channel[0].field_0x23 = '\0';
          in_stack_ffffffffffffffc0->channel[0].field_0x24 = '\0';
          in_stack_ffffffffffffffc0->channel[0].field_0x3b = '\0';
          *(int *)in_stack_ffffffffffffffc0->channel[0].arpeggio_offsets = 0;
          *(uchar *)((long)&in_stack_ffffffffffffffc0->channel[0].arpeggio_shift + 2) = '\0';
          *(uchar *)((long)&in_stack_ffffffffffffffc0->channel[0].arpeggio_shift + 3) = '\0';
          in_stack_ffffffffffffffc0->channel[0].retrig = '\0';
          *(uchar *)((long)&in_stack_ffffffffffffffc0->channel[0].retrig_tick + 3) = '\0';
          in_stack_ffffffffffffffc0->channel[0].tremor = '\0';
          in_stack_ffffffffffffffc0->channel[0].tremor_time = '\0';
          in_stack_ffffffffffffffc0->channel[0].vibrato_waveform = '\0';
          in_stack_ffffffffffffffc0->channel[0].tremolo_waveform = '\0';
          in_stack_ffffffffffffffc0->channel[0].panbrello_waveform = '\0';
          in_stack_ffffffffffffffc0->channel[0].field_0x45 = '\0';
          in_stack_ffffffffffffffc0->channel[0].field_0x46 = '\0';
          in_stack_ffffffffffffffc0->channel[0].field_0x47 = '\0';
          *(uchar *)&in_stack_ffffffffffffffc0->channel[0].portamento = '\0';
          *(uchar *)((long)&in_stack_ffffffffffffffc0->channel[0].portamento + 1) = '\0';
          *(uchar *)((long)&in_stack_ffffffffffffffc0->channel[0].portamento + 2) = '\0';
          *(uchar *)((long)&in_stack_ffffffffffffffc0->channel[0].portamento + 3) = '\0';
          *(uchar *)&in_stack_ffffffffffffffc0->channel[0].toneporta = '\0';
          *(uchar *)((long)&in_stack_ffffffffffffffc0->channel[0].toneporta + 1) = '\0';
          *(uchar *)((long)&in_stack_ffffffffffffffc0->channel[0].toneporta + 2) = '\0';
          *(uchar *)((long)&in_stack_ffffffffffffffc0->channel[0].toneporta + 3) = '\0';
          *(uchar *)&in_stack_ffffffffffffffc0->channel[0].toneslide = '\0';
          *(uchar *)((long)&in_stack_ffffffffffffffc0->channel[0].toneslide + 1) = '\0';
          *(uchar *)((long)&in_stack_ffffffffffffffc0->channel[0].toneslide + 2) = '\0';
          *(uchar *)((long)&in_stack_ffffffffffffffc0->channel[0].toneslide + 3) = '\0';
          in_stack_ffffffffffffffc0->channel[0].toneslide_tick = '\0';
          in_stack_ffffffffffffffc0->channel[0].last_toneslide_tick = '\0';
          in_stack_ffffffffffffffc0->channel[0].ptm_toneslide = '\0';
          in_stack_ffffffffffffffc0->channel[0].ptm_last_toneslide = '\0';
          in_stack_ffffffffffffffc0->channel[0].okt_toneslide = '\0';
          in_stack_ffffffffffffffc0->channel[0].destnote = '\0';
          in_stack_ffffffffffffffc0->channel[0].toneslide_retrig = '\0';
          in_stack_ffffffffffffffc0->channel[0].glissando = '\0';
          *(uchar *)&in_stack_ffffffffffffffc0->channel[0].sample = '\0';
          *(uchar *)((long)&in_stack_ffffffffffffffc0->channel[0].sample + 1) = '\0';
          *(int *)&in_stack_ffffffffffffffc0->channel[0].lastvolslide = 0;
          *(IT_PLAYING **)&in_stack_ffffffffffffffc0->channel[0].lastYspeed = (IT_PLAYING *)0x0;
          *(void **)&in_stack_ffffffffffffffc0->channel[0].lastQ = (void *)0x0;
          *(int *)&in_stack_ffffffffffffffc0->channel[0].xm_lastEA = 0xfffe;
        }
        if ((in_RDI->flags & 0x400U) != 0) {
          reset_effects(in_stack_ffffffffffffffc0);
        }
        for (local_34 = 0; local_34 < 0xc0; local_34 = local_34 + 1) {
          vsigrenderer->playing[local_34] = (IT_PLAYING *)0x0;
        }
        vsigrenderer->speed = in_RDI->speed;
        vsigrenderer->processrow = 0xfffe;
        vsigrenderer->n_rows = 0;
        vsigrenderer->breakrow = 0;
        vsigrenderer->rowcount = 1;
        vsigrenderer->order = in_EDX;
        if (in_EDX < 1) {
          vsigrenderer->restart_position = (uint)in_RDI->restart_position;
        }
        else {
          vsigrenderer->restart_position = in_EDX;
        }
        vsigrenderer->row = 0;
        vsigrenderer->processorder = in_EDX + -1;
        vsigrenderer->tick = 1;
        pvVar2 = bit_array_create((size_t)in_stack_ffffffffffffffc0);
        vsigrenderer->played = pvVar2;
        for (iVar4 = 0; iVar4 < in_RDI->n_orders; iVar4 = iVar4 + 1) {
          if ((int)(uint)in_RDI->order[iVar4] < in_RDI->n_patterns) {
            vsigrenderer->time_left = 0;
            vsigrenderer->sub_time_left = 0;
            pvVar2 = bit_array_create((size_t)in_stack_ffffffffffffffc0);
            vsigrenderer->played = pvVar2;
            vsigrenderer->gvz_time = 0;
            vsigrenderer->gvz_sub_time = 0;
            if ((in_RDI->flags & 0x2000U) == 0) {
              dumb_it_add_lpc(in_stack_00000ae0);
              in_RDI->flags = in_RDI->flags | 0x2000;
              return vsigrenderer;
            }
            return vsigrenderer;
          }
          if (in_RDI->order[iVar4] != 0xfe) break;
          for (iVar3 = 0; iVar3 < 0x100; iVar3 = iVar3 + 1) {
            bit_array_set(vsigrenderer->played,(long)(iVar4 * 0x100 + iVar3));
          }
        }
        _dumb_it_end_sigrenderer(vsigrenderer);
      }
    }
  }
  return (DUMB_IT_SIGRENDERER *)0x0;
}

Assistant:

static DUMB_IT_SIGRENDERER *init_sigrenderer(DUMB_IT_SIGDATA *sigdata, int n_channels, int startorder, IT_CALLBACKS *callbacks, DUMB_CLICK_REMOVER **cr)
{
	DUMB_IT_SIGRENDERER *sigrenderer;
	int i;

	/* [RH] Mono destination mixers are disabled. */
	if (n_channels != 2) {
		return NULL;
	}

	if (startorder > sigdata->n_orders) {
		free(callbacks);
		dumb_destroy_click_remover_array(n_channels, cr);
		return NULL;
	}

	sigrenderer = malloc(sizeof(*sigrenderer));
	if (!sigrenderer) {
		free(callbacks);
		dumb_destroy_click_remover_array(n_channels, cr);
		return NULL;
	}

	sigrenderer->free_playing = NULL;
	sigrenderer->callbacks = callbacks;
	sigrenderer->click_remover = cr;

	sigrenderer->sigdata = sigdata;
	sigrenderer->n_channels = n_channels;
	sigrenderer->resampling_quality = dumb_resampling_quality;
    sigrenderer->ramp_style = DUMB_IT_RAMP_FULL;
	sigrenderer->globalvolume = sigdata->global_volume;
	sigrenderer->tempo = sigdata->tempo;

	for (i = 0; i < DUMB_IT_N_CHANNELS; i++) {
		IT_CHANNEL *channel = &sigrenderer->channel[i];
#if IT_CHANNEL_MUTED != 1
#error this is wrong
#endif
		channel->flags = sigdata->channel_pan[i] >> 7;
		channel->volume = (sigdata->flags & IT_WAS_AN_XM) ? 0 : 64;
		channel->pan = sigdata->channel_pan[i] & 0x7F;
		channel->truepan = channel->pan << IT_ENVELOPE_SHIFT;
		channel->channelvolume = sigdata->channel_volume[i];
		channel->instrument = 0;
		channel->sample = 0;
		channel->note = IT_NOTE_OFF;
		channel->SFmacro = 0;
		channel->filter_cutoff = 127;
		channel->filter_resonance = 0;
		channel->new_note_action = 0xFF;
		channel->xm_retrig = 0;
		channel->retrig_tick = 0;
		channel->tremor_time = 0;
		channel->vibrato_waveform = 0;
		channel->tremolo_waveform = 0;
		channel->panbrello_waveform = 0;
		channel->glissando = 0;
		channel->toneslide = 0;
		channel->ptm_toneslide = 0;
		channel->ptm_last_toneslide = 0;
		channel->okt_toneslide = 0;
		channel->midi_state = 0;
		channel->lastvolslide = 0;
		channel->lastDKL = 0;
		channel->lastEF = 0;
		channel->lastG = 0;
		channel->lastHspeed = 0;
		channel->lastHdepth = 0;
		channel->lastRspeed = 0;
		channel->lastRdepth = 0;
		channel->lastYspeed = 0;
		channel->lastYdepth = 0;
		channel->lastI = 0;
		channel->lastJ = 0;
		channel->lastN = 0;
		channel->lastO = 0;
		channel->high_offset = 0;
		channel->lastP = 0;
		channel->lastQ = 0;
		channel->lastS = 0;
		channel->pat_loop_row = 0;
		channel->pat_loop_count = 0;
		channel->pat_loop_end_row = 0;
		channel->lastW = 0;
		channel->xm_lastE1 = 0;
		channel->xm_lastE2 = 0;
		channel->xm_lastEA = 0;
		channel->xm_lastEB = 0;
		channel->xm_lastX1 = 0;
		channel->xm_lastX2 = 0;
		channel->inv_loop_delay = 0;
		channel->inv_loop_speed = 0;
		channel->inv_loop_offset = 0;
		channel->playing = NULL;
#ifdef BIT_ARRAY_BULLSHIT
		channel->played_patjump = NULL;
		channel->played_patjump_order = 0xFFFE;
#endif
		//channel->output = 0;
	}

	if (sigdata->flags & IT_WAS_A_669)
		reset_effects(sigrenderer);

	for (i = 0; i < DUMB_IT_N_NNA_CHANNELS; i++)
		sigrenderer->playing[i] = NULL;

	sigrenderer->speed = sigdata->speed;

	sigrenderer->processrow = 0xFFFE;
	sigrenderer->n_rows = 0;
	sigrenderer->breakrow = 0;
	sigrenderer->rowcount = 1;
	sigrenderer->order = startorder;
	/* meh!
	if (startorder > 0) {
		int n;
		for (n = startorder - 1; n >= 0; n--) {
			if (sigdata->order[n] > sigdata->n_patterns) {
				sigrenderer->restart_position = n + 1;
				break;
			}
		}
	}
	*/
	if (startorder > 0) {
		sigrenderer->restart_position = startorder;
	} else {
		sigrenderer->restart_position = sigdata->restart_position;
	}

	sigrenderer->row = 0;
	sigrenderer->processorder = startorder - 1;
	sigrenderer->tick = 1;

#ifdef BIT_ARRAY_BULLSHIT
	sigrenderer->played = bit_array_create(sigdata->n_orders * 256);
#endif

	{
		int order;
		for (order = 0; order < sigdata->n_orders; order++) {
			int n = sigdata->order[order];
			if (n < sigdata->n_patterns) goto found_valid_order;
#ifdef INVALID_ORDERS_END_SONG
			if (n != IT_ORDER_SKIP)
#else
			if (n == IT_ORDER_END)
#endif
				break;

#ifdef BIT_ARRAY_BULLSHIT
			/* Fix for played order detection for songs which have skips at the start of the orders list */
			for (n = 0; n < 256; n++) {
				bit_array_set(sigrenderer->played, order * 256 + n);
			}
#endif
		}
		/* If we get here, there were no valid orders in the song. */
		_dumb_it_end_sigrenderer(sigrenderer);
		return NULL;
	}
	found_valid_order:

	sigrenderer->time_left = 0;
	sigrenderer->sub_time_left = 0;

#ifdef BIT_ARRAY_BULLSHIT
	sigrenderer->played = bit_array_create(sigdata->n_orders * 256);
#endif

	sigrenderer->gvz_time = 0;
	sigrenderer->gvz_sub_time = 0;

	//sigrenderer->max_output = 0;

	if ( !(sigdata->flags & IT_WAS_PROCESSED) ) {
		dumb_it_add_lpc( sigdata );

		sigdata->flags |= IT_WAS_PROCESSED;
	}

	return sigrenderer;
}